

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O2

int lj_cf_ffi_copy(lua_State *L)

{
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar1;
  uint uVar2;
  void *__dest;
  void *__src;
  
  __dest = ffi_checkptr(L,1,0x11);
  __src = ffi_checkptr(L,2,0x12);
  aVar1 = L->base[1].field_4;
  if ((aVar1.it >> 0xf == 0x1fffb) && (L->top <= L->base + 2)) {
    uVar2 = *(int *)(((ulong)aVar1 & 0x7fffffffffff) + 0x14) + 1;
  }
  else {
    uVar2 = ffi_checkint(L,3);
  }
  memcpy(__dest,__src,(ulong)uVar2);
  return 0;
}

Assistant:

LJLIB_CF(ffi_copy)	LJLIB_REC(.)
{
  void *dp = ffi_checkptr(L, 1, CTID_P_VOID);
  void *sp = ffi_checkptr(L, 2, CTID_P_CVOID);
  TValue *o = L->base+1;
  CTSize len;
  if (tvisstr(o) && o+1 >= L->top)
    len = strV(o)->len+1;  /* Copy Lua string including trailing '\0'. */
  else
    len = (CTSize)ffi_checkint(L, 3);
  memcpy(dp, sp, len);
  return 0;
}